

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O1

void google::protobuf::compiler::javanano::anon_unknown_5::SetPrimitiveVariables
               (FieldDescriptor *descriptor,Params *params,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  pointer pcVar1;
  char *pcVar2;
  pointer pcVar3;
  string *src;
  ulong uVar4;
  Params *this;
  ulong uVar5;
  bool bVar6;
  Type TVar7;
  JavaType JVar8;
  uint uVar9;
  mapped_type *pmVar10;
  LogMessage *other;
  long *plVar11;
  undefined1 *puVar12;
  FieldDescriptor *pFVar13;
  size_type *psVar14;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int iVar15;
  JavaType type;
  JavaType type_00;
  JavaType type_01;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint i;
  uint i_00;
  int i_01;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  unsigned_long i_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor *extraout_RDX_07;
  FieldDescriptor *extraout_RDX_08;
  size_type sVar16;
  size_type *psVar17;
  ulong uVar18;
  char *__s;
  SubstituteArg *in_stack_fffffffffffffd78;
  undefined1 local_280 [56];
  undefined1 local_248 [48];
  undefined1 local_218 [48];
  key_type local_1e8;
  string local_1c8;
  string local_1a8;
  Params *local_188;
  undefined1 local_180 [48];
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  UnderscoresToCamelCase_abi_cxx11_
            ((string *)local_248,(javanano *)descriptor,(FieldDescriptor *)variables);
  RenameJavaKeywords((string *)local_280,(string *)local_248);
  local_218._0_8_ = local_218 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"name","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_218);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  pFVar13 = extraout_RDX;
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    pFVar13 = extraout_RDX_00;
  }
  psVar17 = (size_type *)(local_280 + 0x10);
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    pFVar13 = extraout_RDX_01;
  }
  pcVar1 = local_248 + 0x10;
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    pFVar13 = extraout_RDX_02;
  }
  UnderscoresToCapitalizedCamelCase_abi_cxx11_((string *)local_248,(javanano *)descriptor,pFVar13);
  RenameJavaKeywords((string *)local_280,(string *)local_248);
  local_218._0_8_ = local_218 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"capitalized_name","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_218);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  iVar15 = extraout_EDX;
  if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    iVar15 = extraout_EDX_00;
  }
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    iVar15 = extraout_EDX_01;
  }
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    iVar15 = extraout_EDX_02;
  }
  SimpleItoa_abi_cxx11_((string *)local_280,(protobuf *)(ulong)*(uint *)(descriptor + 0x38),iVar15);
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"number","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_248);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  if ((params->use_reference_types_for_primitives_ == true) && (*(int *)(descriptor + 0x4c) != 3)) {
    TVar7 = FieldDescriptor::type(descriptor);
    JVar8 = GetJavaType(TVar7);
    BoxedPrimitiveTypeName_abi_cxx11_((string *)local_280,(javanano *)(ulong)JVar8,type_00);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"type","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
  }
  else {
    TVar7 = FieldDescriptor::type(descriptor);
    JVar8 = GetJavaType(TVar7);
    PrimitiveTypeName_abi_cxx11_((string *)local_280,(javanano *)(ulong)JVar8,type);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"type","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
  }
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  TVar7 = FieldDescriptor::type(descriptor);
  puVar12 = FieldDescriptor::kTypeToCppTypeMap;
  local_188 = params;
  if (((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar7 * 4) == 9) &&
      (*(long *)(*(long *)(descriptor + 0xa0) + 8) != 0)) &&
     (params->use_reference_types_for_primitives_ == false)) {
    TVar7 = FieldDescriptor::type(descriptor);
    if (TVar7 != TYPE_BYTES) {
      src = *(string **)(descriptor + 0xa0);
      uVar4 = src->_M_string_length;
      pFVar13 = (FieldDescriptor *)CONCAT71((int7)((ulong)puVar12 >> 8),uVar4 == 0);
      if (uVar4 == 0) {
LAB_002ad52a:
        if ((char)pFVar13 != '\0') {
          CEscape((string *)local_218,src);
          plVar11 = (long *)std::__cxx11::string::replace((ulong)local_218,0,(char *)0x0,0x356830);
          psVar14 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar14) {
            local_248._16_8_ = *psVar14;
            local_248._24_8_ = plVar11[3];
            local_248._0_8_ = pcVar1;
          }
          else {
            local_248._16_8_ = *psVar14;
            local_248._0_8_ = (size_type *)*plVar11;
          }
          local_248._8_8_ = plVar11[1];
          *plVar11 = (long)psVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append(local_248);
          psVar14 = (size_type *)(plVar11 + 2);
          if ((size_type *)*plVar11 == psVar14) {
            local_280._16_8_ = *psVar14;
            local_280._24_4_ = (undefined4)plVar11[3];
            local_280._28_4_ = *(undefined4 *)((long)plVar11 + 0x1c);
            local_280._0_8_ = psVar17;
          }
          else {
            local_280._16_8_ = *psVar14;
            local_280._0_8_ = (size_type *)*plVar11;
          }
          local_280._8_8_ = plVar11[1];
          *plVar11 = (long)psVar14;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          local_180._0_8_ = local_180 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"default","");
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](variables,(key_type *)local_180);
          std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
          if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
            operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
          }
          if ((size_type *)local_280._0_8_ != psVar17) {
            operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
          }
          if ((pointer)local_248._0_8_ != pcVar1) {
            operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
          }
          if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          local_280._0_8_ = psVar17;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"default","");
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[](variables,(key_type *)local_280);
          local_248._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_248,"default_copy_if_needed","");
          pmVar10 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](variables,(key_type *)local_248);
          std::__cxx11::string::_M_assign((string *)pmVar10);
          goto LAB_002acd04;
        }
      }
      else {
        pFVar13 = (FieldDescriptor *)(src->_M_dataplus)._M_p;
        if (-1 < (char)*pFVar13) {
          uVar5 = 1;
          do {
            uVar18 = uVar5;
            if (uVar4 == uVar18) break;
            uVar5 = uVar18 + 1;
          } while (-1 < (char)pFVar13[uVar18]);
          pFVar13 = (FieldDescriptor *)CONCAT71((int7)((ulong)pFVar13 >> 8),uVar4 <= uVar18);
          goto LAB_002ad52a;
        }
      }
      DefaultValue_abi_cxx11_((string *)local_280,(javanano *)params,(Params *)descriptor,pFVar13);
      local_248._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)local_248);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
      pFVar13 = extraout_RDX_06;
      if ((pointer)local_248._0_8_ != pcVar1) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        pFVar13 = extraout_RDX_07;
      }
      if ((size_type *)local_280._0_8_ != psVar17) {
        operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
        pFVar13 = extraout_RDX_08;
      }
      FieldDefaultConstantName_abi_cxx11_((string *)local_280,(javanano *)descriptor,pFVar13);
      local_248._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default_constant","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)local_248);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
      if ((pointer)local_248._0_8_ != pcVar1) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((size_type *)local_280._0_8_ != psVar17) {
        operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      }
      CEscape(&local_1a8,*(string **)(descriptor + 0xa0));
      local_280._0_8_ = local_1a8._M_dataplus._M_p;
      local_280._8_4_ = (undefined4)local_1a8._M_string_length;
      local_248._0_8_ = (pointer)0x0;
      local_248._8_4_ = 0xffffffff;
      local_218._0_8_ = (pointer)0x0;
      local_218._8_4_ = -1;
      local_180._0_8_ = (char *)0x0;
      local_180._8_4_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_1c8,
                 (strings *)"com.google.protobuf.nano.InternalNano.stringDefaultValue(\"$0\")",
                 local_280,(SubstituteArg *)local_248,(SubstituteArg *)local_218,
                 (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
                 &local_150,in_stack_fffffffffffffd78);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"default_constant_value","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,&local_1e8);
      std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      local_280._0_8_ = local_280 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"default","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](variables,(key_type *)local_280);
      local_248._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_248,"default_copy_if_needed","");
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](variables,(key_type *)local_248);
      std::__cxx11::string::_M_assign((string *)pmVar10);
      goto LAB_002acd04;
    }
    DefaultValue_abi_cxx11_
              ((string *)local_280,(javanano *)params,(Params *)descriptor,
               (FieldDescriptor *)puVar12);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
    pFVar13 = extraout_RDX_03;
    if ((pointer)local_248._0_8_ != pcVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      pFVar13 = extraout_RDX_04;
    }
    if ((size_type *)local_280._0_8_ != psVar17) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
      pFVar13 = extraout_RDX_05;
    }
    FieldDefaultConstantName_abi_cxx11_((string *)local_280,(javanano *)descriptor,pFVar13);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default_constant","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
    if ((pointer)local_248._0_8_ != pcVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((size_type *)local_280._0_8_ != psVar17) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    CEscape(&local_1a8,*(string **)(descriptor + 0xa0));
    local_280._0_8_ = local_1a8._M_dataplus._M_p;
    local_280._8_4_ = (undefined4)local_1a8._M_string_length;
    local_248._0_8_ = (pointer)0x0;
    local_248._8_4_ = 0xffffffff;
    local_218._0_8_ = (pointer)0x0;
    local_218._8_4_ = -1;
    local_180._0_8_ = (char *)0x0;
    local_180._8_4_ = -1;
    local_60.text_ = (char *)0x0;
    local_60.size_ = -1;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_1c8,
               (strings *)"com.google.protobuf.nano.InternalNano.bytesDefaultValue(\"$0\")",
               local_280,(SubstituteArg *)local_248,(SubstituteArg *)local_218,
               (SubstituteArg *)local_180,&local_60,&local_90,&local_c0,&local_f0,&local_120,
               &local_150,in_stack_fffffffffffffd78);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1e8,"default_constant_value","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,&local_1e8);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
    pcVar3 = (pmVar10->_M_dataplus)._M_p;
    local_280._0_8_ = local_280 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_280,pcVar3,pcVar3 + pmVar10->_M_string_length);
    std::__cxx11::string::append(local_280);
    local_218._0_8_ = local_218 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"default_copy_if_needed","")
    ;
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_218);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
    }
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    sVar16 = local_248._16_8_;
    psVar17 = (size_type *)local_248._0_8_;
    if ((pointer)local_248._0_8_ == pcVar1) goto LAB_002acd32;
  }
  else {
    DefaultValue_abi_cxx11_
              ((string *)local_280,(javanano *)params,(Params *)descriptor,
               (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
    if ((pointer)local_248._0_8_ != pcVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((size_type *)local_280._0_8_ != psVar17) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
    local_280._0_8_ = psVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"default","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](variables,(key_type *)local_280);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"default_copy_if_needed","")
    ;
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
    std::__cxx11::string::_M_assign((string *)pmVar10);
LAB_002acd04:
    if ((pointer)local_248._0_8_ != pcVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    sVar16 = local_280._16_8_;
    psVar17 = (size_type *)local_280._0_8_;
    if ((undefined1 *)local_280._0_8_ == local_280 + 0x10) goto LAB_002acd32;
  }
  operator_delete(psVar17,sVar16 + 1);
LAB_002acd32:
  TVar7 = FieldDescriptor::type(descriptor);
  JVar8 = GetJavaType(TVar7);
  BoxedPrimitiveTypeName_abi_cxx11_((string *)local_280,(javanano *)(ulong)JVar8,type_01);
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"boxed_type","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_248);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  TVar7 = FieldDescriptor::type(descriptor);
  if (TVar7 - TYPE_DOUBLE < 0x12) {
    __s = &DAT_0039dcd0 + *(int *)(&DAT_0039dcd0 + (ulong)(TVar7 - TYPE_DOUBLE) * 4);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_280,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_primitive_field.cc"
               ,0x7a);
    other = internal::LogMessage::operator<<((LogMessage *)local_280,"Can\'t get here.");
    internal::LogFinisher::operator=((LogFinisher *)local_248,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_280);
    __s = (char *)0x0;
  }
  local_280._0_8_ = local_280 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"capitalized_type","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_280);
  pcVar2 = (char *)pmVar10->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)pmVar10,0,pcVar2,(ulong)__s);
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  iVar15 = *(int *)(descriptor + 0x38);
  bVar6 = FieldDescriptor::is_packed(descriptor);
  uVar9 = 2;
  i = extraout_EDX_03;
  if (!bVar6) {
    TVar7 = FieldDescriptor::type(descriptor);
    uVar9 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar7 * 4);
    i = extraout_EDX_04;
  }
  SimpleItoa_abi_cxx11_((string *)local_280,(protobuf *)(ulong)(iVar15 << 3 | uVar9),i);
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"tag","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_248);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  iVar15 = *(int *)(descriptor + 0x38);
  TVar7 = FieldDescriptor::type(descriptor);
  uVar9 = iVar15 * 8 + 1;
  iVar15 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> iVar15 == 0; iVar15 = iVar15 + -1) {
    }
  }
  SimpleItoa_abi_cxx11_
            ((string *)local_280,
             (protobuf *)((ulong)(iVar15 * 9 + 0x49U >> 6) << (TVar7 == TYPE_GROUP)),i_02);
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"tag_size","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_248);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  iVar15 = *(int *)(descriptor + 0x38);
  TVar7 = FieldDescriptor::type(descriptor);
  puVar12 = internal::WireFormatLite::kWireTypeForFieldType;
  SimpleItoa_abi_cxx11_
            ((string *)local_280,
             (protobuf *)
             (ulong)(iVar15 << 3 |
                    *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar7 * 4)),
             i_00);
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"non_packed_tag","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_248);
  this = local_188;
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  psVar17 = (size_type *)(local_280 + 0x10);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  TVar7 = FieldDescriptor::type(descriptor);
  uVar9 = FixedSize(TVar7);
  if (uVar9 != 0xffffffff) {
    SimpleItoa_abi_cxx11_((string *)local_280,(protobuf *)(ulong)uVar9,i_01);
    local_248._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"fixed_size","");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](variables,(key_type *)local_248);
    std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
    if ((pointer)local_248._0_8_ != pcVar1) {
      operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
    }
    if ((size_type *)local_280._0_8_ != psVar17) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
  }
  local_280._0_8_ = psVar17;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"message_name","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_280);
  std::__cxx11::string::_M_assign((string *)pmVar10);
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  EmptyArrayName_abi_cxx11_
            ((string *)local_280,(javanano *)this,(Params *)descriptor,(FieldDescriptor *)puVar12);
  local_248._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"empty_array_name","");
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](variables,(key_type *)local_248);
  std::__cxx11::string::operator=((string *)pmVar10,(string *)local_280);
  if ((pointer)local_248._0_8_ != pcVar1) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
  }
  if ((size_type *)local_280._0_8_ != psVar17) {
    operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
  }
  return;
}

Assistant:

void SetPrimitiveVariables(const FieldDescriptor* descriptor, const Params params,
                           map<string, string>* variables) {
  (*variables)["name"] =
    RenameJavaKeywords(UnderscoresToCamelCase(descriptor));
  (*variables)["capitalized_name"] =
    RenameJavaKeywords(UnderscoresToCapitalizedCamelCase(descriptor));
  (*variables)["number"] = SimpleItoa(descriptor->number());
  if (params.use_reference_types_for_primitives()
      && !descriptor->is_repeated()) {
    (*variables)["type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  } else {
    (*variables)["type"] = PrimitiveTypeName(GetJavaType(descriptor));
  }
  // Deals with defaults. For C++-string types (string and bytes),
  // we might need to have the generated code do the unicode decoding
  // (see comments in InternalNano.java for gory details.). We would
  // like to do this once into a static field and re-use that from
  // then on.
  if (descriptor->cpp_type() == FieldDescriptor::CPPTYPE_STRING &&
      !descriptor->default_value_string().empty() &&
      !params.use_reference_types_for_primitives()) {
    if (descriptor->type() == FieldDescriptor::TYPE_BYTES) {
      (*variables)["default"] = DefaultValue(params, descriptor);
      (*variables)["default_constant"] = FieldDefaultConstantName(descriptor);
      (*variables)["default_constant_value"] = strings::Substitute(
          "com.google.protobuf.nano.InternalNano.bytesDefaultValue(\"$0\")",
          CEscape(descriptor->default_value_string()));
      (*variables)["default_copy_if_needed"] =
          (*variables)["default"] + ".clone()";
    } else if (AllAscii(descriptor->default_value_string())) {
      // All chars are ASCII.  In this case directly referencing a
      // CEscape()'d string literal works fine.
      (*variables)["default"] =
          "\"" + CEscape(descriptor->default_value_string()) + "\"";
      (*variables)["default_copy_if_needed"] = (*variables)["default"];
    } else {
      // Strings where some chars are non-ASCII. We need to save the
      // default value.
      (*variables)["default"] = DefaultValue(params, descriptor);
      (*variables)["default_constant"] = FieldDefaultConstantName(descriptor);
      (*variables)["default_constant_value"] = strings::Substitute(
          "com.google.protobuf.nano.InternalNano.stringDefaultValue(\"$0\")",
          CEscape(descriptor->default_value_string()));
      (*variables)["default_copy_if_needed"] = (*variables)["default"];
    }
  } else {
    // Non-string, non-bytes field. Defaults are literals.
    (*variables)["default"] = DefaultValue(params, descriptor);
    (*variables)["default_copy_if_needed"] = (*variables)["default"];
  }
  (*variables)["boxed_type"] = BoxedPrimitiveTypeName(GetJavaType(descriptor));
  (*variables)["capitalized_type"] = GetCapitalizedType(descriptor);
  (*variables)["tag"] = SimpleItoa(WireFormat::MakeTag(descriptor));
  (*variables)["tag_size"] = SimpleItoa(
      WireFormat::TagSize(descriptor->number(), descriptor->type()));
  (*variables)["non_packed_tag"] = SimpleItoa(
      internal::WireFormatLite::MakeTag(descriptor->number(),
          internal::WireFormat::WireTypeForFieldType(descriptor->type())));
  int fixed_size = FixedSize(descriptor->type());
  if (fixed_size != -1) {
    (*variables)["fixed_size"] = SimpleItoa(fixed_size);
  }
  (*variables)["message_name"] = descriptor->containing_type()->name();
  (*variables)["empty_array_name"] = EmptyArrayName(params, descriptor);
}